

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigPostprocess(Ivy_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  uint local_18;
  int nChoiceNodes;
  int nChoices;
  int fVerbose_local;
  Ivy_Man_t *p_local;
  
  nChoiceNodes = fVerbose;
  _nChoices = p;
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyHaig.c"
                  ,0x162,"void Ivy_ManHaigPostprocess(Ivy_Man_t *, int)");
  }
  if (fVerbose != 0) {
    printf("Final    : ");
    Ivy_ManPrintStats(_nChoices);
    printf("HAIG     : ");
    Ivy_ManPrintStats(_nChoices->pHaig);
    uVar1 = Ivy_ManHaigCountChoices(_nChoices,(int *)&local_18);
    printf("Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n",(ulong)uVar1,
           (ulong)local_18,(ulong)(uint)_nChoices->pHaig->nClassesSkip);
  }
  iVar2 = Ivy_ManIsAcyclic(_nChoices->pHaig);
  if (iVar2 == 0) {
    printf("HAIG contains a cycle\n");
  }
  else if (nChoiceNodes != 0) {
    printf("HAIG is acyclic\n");
  }
  return;
}

Assistant:

void Ivy_ManHaigPostprocess( Ivy_Man_t * p, int fVerbose )
{
    int nChoices, nChoiceNodes;

    assert( p->pHaig != NULL );

    if ( fVerbose )
    {
        printf( "Final    : " );
        Ivy_ManPrintStats( p );
        printf( "HAIG     : " );
        Ivy_ManPrintStats( p->pHaig );

        // print choice node stats
        nChoiceNodes = Ivy_ManHaigCountChoices( p, &nChoices );
        printf( "Total choice nodes = %d. Total choices = %d. Skipped classes = %d.\n", 
            nChoiceNodes, nChoices, p->pHaig->nClassesSkip ); 
    }

    if ( Ivy_ManIsAcyclic( p->pHaig ) )
    {
        if ( fVerbose )
            printf( "HAIG is acyclic\n" );
    }
    else
        printf( "HAIG contains a cycle\n" );

//    if ( fVerbose )
//        Ivy_ManHaigSimulate( p );
}